

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char> __thiscall
fmt::v7::detail::write_bytes<char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,string_view bytes,basic_format_specs<char> *specs)

{
  size_t size;
  buffer_appender<char> bVar1;
  anon_class_16_1_a7b7af8b local_48;
  buffer_appender<char> local_38;
  basic_format_specs<char> *local_30;
  basic_format_specs<char> *specs_local;
  string_view bytes_local;
  buffer_appender<char> out_local;
  
  bytes_local.data_ = bytes.data_;
  local_38.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)this;
  local_30 = (basic_format_specs<char> *)bytes.size_;
  specs_local = (basic_format_specs<char> *)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bytes_local.size_ = (size_t)this;
  size = basic_string_view<char>::size((basic_string_view<char> *)&specs_local);
  local_48.bytes.data_ = (char *)specs_local;
  local_48.bytes.size_ = (size_t)bytes_local.data_;
  bVar1 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_bytes<char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    (local_38,(basic_format_specs<char> *)bytes.size_,size,&local_48);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}